

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_filesystem.cpp
# Opt level: O0

path * __thiscall Omega_h::filesystem::path::filename(path *__return_storage_ptr__,path *this)

{
  string local_40 [32];
  long local_20;
  size_type last_sep_pos;
  path *this_local;
  
  last_sep_pos = (size_type)this;
  this_local = __return_storage_ptr__;
  local_20 = std::__cxx11::string::find_last_of((char)this,0x2f);
  if (local_20 == -1) {
    path(__return_storage_ptr__,&this->impl);
  }
  else {
    std::__cxx11::string::substr((ulong)local_40,(ulong)this);
    path(__return_storage_ptr__,local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

path path::filename() const {
  auto const last_sep_pos = impl.find_last_of(preferred_separator);
  if (last_sep_pos == std::string::npos) return impl;
  return impl.substr(last_sep_pos + 1, std::string::npos);
}